

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O0

void __thiscall
LINAnalyzerResults::GenerateFrameTabularText
          (LINAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  char local_218 [8];
  char seq_str_1 [128];
  char seq_str [128];
  string local_108 [8];
  string str;
  string local_e8 [8];
  string fault_str;
  char local_c8 [8];
  char number_str [128];
  Frame frame;
  ulonglong local_38;
  long local_30;
  undefined1 local_28;
  byte local_27;
  DisplayBase display_base_local;
  U64 frame_index_local;
  LINAnalyzerResults *this_local;
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)(number_str + 0x78));
  std::__cxx11::string::string(local_e8);
  std::__cxx11::string::string(local_108);
  if ((local_27 & 1) != 0) {
    std::__cxx11::string::operator+=(local_e8,"!FRAME");
  }
  if ((local_27 & 2) != 0) {
    std::__cxx11::string::operator+=(local_e8,"!BREAK");
  }
  if ((local_27 & 4) != 0) {
    std::__cxx11::string::operator+=(local_e8,"!SYNC");
  }
  if ((local_27 & 8) != 0) {
    std::__cxx11::string::operator+=(local_e8,"!CHK");
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    AnalyzerHelpers::GetNumberString(local_38,display_base,8,local_c8,0x80);
    switch(local_28) {
    default:
      std::__cxx11::string::operator+=(local_108,"Inter-Byte Space");
      break;
    case 1:
      std::__cxx11::string::operator+=(local_108,"Header Break");
      break;
    case 2:
      std::__cxx11::string::operator+=(local_108,"Header Sync");
      break;
    case 3:
      AnalyzerHelpers::GetNumberString((ulong)((uint)local_38 & 0x3f),display_base,8,local_c8,0x80);
      std::__cxx11::string::operator+=(local_108,"Protected ID: ");
      std::__cxx11::string::operator+=(local_108,local_c8);
      break;
    case 4:
    case 5:
      AnalyzerHelpers::GetNumberString(local_30 - 1,Decimal,8,seq_str_1 + 0x78,0x80);
      std::__cxx11::string::operator+=(local_108,"Data ");
      std::__cxx11::string::operator+=(local_108,seq_str_1 + 0x78);
      std::__cxx11::string::operator+=(local_108,": ");
      std::__cxx11::string::operator+=(local_108,local_c8);
      break;
    case 6:
      std::__cxx11::string::operator+=(local_108,"Checksum: ");
      std::__cxx11::string::operator+=(local_108,local_c8);
      break;
    case 7:
      bVar1 = IsFrameChecksum(this,frame_index);
      if (bVar1) {
        std::__cxx11::string::operator+=(local_108,"Checksum: ");
        std::__cxx11::string::operator+=(local_108,local_c8);
      }
      else {
        AnalyzerHelpers::GetNumberString(local_30 - 1,Decimal,8,local_218,0x80);
        std::__cxx11::string::operator+=(local_108,"Data ");
        std::__cxx11::string::operator+=(local_108,local_218);
        std::__cxx11::string::operator+=(local_108,": ");
        std::__cxx11::string::operator+=(local_108,local_c8);
      }
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddTabularText
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    std::__cxx11::string::operator+=(local_e8,"!");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    AnalyzerResults::AddTabularText
              ((char *)this,pcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_e8);
  Frame::~Frame((Frame *)(number_str + 0x78));
  return;
}

Assistant:

void LINAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    char number_str[ 128 ];
    std::string fault_str;
    std::string str;

    if( frame.mFlags & byteFramingError )
        fault_str += "!FRAME";
    if( frame.mFlags & headerBreakExpected )
        fault_str += "!BREAK";
    if( frame.mFlags & headerSyncExpected )
        fault_str += "!SYNC";
    if( frame.mFlags & checksumMismatch )
        fault_str += "!CHK";
    if( fault_str.length() )
    {
        fault_str += "!";
        AddTabularText( fault_str.c_str() );
    }
    else
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

        switch( ( LINAnalyzerResults::tLINFrameState )frame.mType )
        {
        default:
        case LINAnalyzerResults::NoFrame:

            str += "Inter-Byte Space";
            // AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, str, 128 );
            break;

        case LINAnalyzerResults::headerBreak: // expecting break.

            str += "Header Break";
            break;

        case LINAnalyzerResults::headerSync: // expecting sync.

            str += "Header Sync";
            break;

        case LINAnalyzerResults::headerPID: // expecting PID.

            AnalyzerHelpers::GetNumberString( frame.mData1 & 0x3F, display_base, 8, number_str, 128 );
            str += "Protected ID: ";
            str += number_str;
            break;

        // LIN Response
        case LINAnalyzerResults::responseDataZero: // expecting first resppnse data byte.
        case LINAnalyzerResults::responseData:     // expecting response data.
        {
            char seq_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
            str += "Data ";
            str += seq_str;
            str += ": ";
            str += number_str;
        }
        break;
        case LINAnalyzerResults::responseChecksum: // expecting checksum.
            str += "Checksum: ";
            str += number_str;
            break;
        case LINAnalyzerResults::responsePotentialChecksum:
            if( IsFrameChecksum( frame_index ) )
            {
                str += "Checksum: ";
                str += number_str;
            }
            else
            {
                char seq_str[ 128 ];
                AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
                str += "Data ";
                str += seq_str;
                str += ": ";
                str += number_str;
            }

            break;
        }

        AddTabularText( str.c_str() );
    }
}